

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O1

void __thiscall
duckdb_parquet::EncryptionAlgorithm::__set_AES_GCM_V1(EncryptionAlgorithm *this,AesGcmV1 *val)

{
  std::__cxx11::string::_M_assign((string *)&(this->AES_GCM_V1).aad_prefix);
  std::__cxx11::string::_M_assign((string *)&(this->AES_GCM_V1).aad_file_unique);
  (this->AES_GCM_V1).supply_aad_prefix = val->supply_aad_prefix;
  (this->AES_GCM_V1).__isset = val->__isset;
  this->__isset = (_EncryptionAlgorithm__isset)((byte)this->__isset | 1);
  return;
}

Assistant:

void EncryptionAlgorithm::__set_AES_GCM_V1(const AesGcmV1& val) {
  this->AES_GCM_V1 = val;
__isset.AES_GCM_V1 = true;
}